

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * Qt::reset(QTextStream *stream)

{
  QTextStream *in_RDI;
  
  QTextStream::reset(stream);
  return in_RDI;
}

Assistant:

QTextStream &reset(QTextStream &stream)
{
    stream.reset();
    return stream;
}